

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

UniquePtr<SSL_SESSION> __thiscall
bssl::anon_unknown_0::CreateTestSession(anon_unknown_0 *this,uint32_t number)

{
  int iVar1;
  SSL_METHOD *meth;
  UniquePtr<SSL_SESSION> ret;
  UniquePtr<SSL_CTX> ssl_ctx;
  uint8_t id [32];
  _Head_base<0UL,_ssl_session_st_*,_false> local_48;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_40;
  ulong local_38 [5];
  
  meth = (SSL_METHOD *)TLS_method();
  local_40._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
  if (local_40._M_head_impl == (ssl_ctx_st *)0x0) {
    *(undefined8 *)this = 0;
    goto LAB_00172088;
  }
  local_48._M_head_impl = (ssl_session_st *)SSL_SESSION_new();
  if ((SSL_SESSION *)local_48._M_head_impl == (SSL_SESSION *)0x0) {
LAB_00172070:
    *(undefined8 *)this = 0;
  }
  else {
    local_38[1] = 0;
    local_38[2] = 0;
    local_38[3] = 0;
    local_38[0] = (ulong)number;
    iVar1 = SSL_SESSION_set1_id(local_48._M_head_impl,(uint8_t *)local_38,0x20);
    if (iVar1 == 0) goto LAB_00172070;
    *(ssl_session_st **)this = local_48._M_head_impl;
    local_48._M_head_impl = (ssl_session_st *)0x0;
  }
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_48);
LAB_00172088:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_40);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<SSL_SESSION> CreateTestSession(uint32_t number) {
  bssl::UniquePtr<SSL_CTX> ssl_ctx(SSL_CTX_new(TLS_method()));
  if (!ssl_ctx) {
    return nullptr;
  }
  bssl::UniquePtr<SSL_SESSION> ret(SSL_SESSION_new(ssl_ctx.get()));
  if (!ret) {
    return nullptr;
  }

  uint8_t id[SSL3_SSL_SESSION_ID_LENGTH] = {0};
  OPENSSL_memcpy(id, &number, sizeof(number));
  if (!SSL_SESSION_set1_id(ret.get(), id, sizeof(id))) {
    return nullptr;
  }
  return ret;
}